

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_asvp.c
# Opt level: O1

void * ares_htable_asvp_get_direct(ares_htable_asvp_t *htable,ares_socket_t key)

{
  void *pvVar1;
  undefined1 local_4 [4];
  
  if ((htable != (ares_htable_asvp_t *)0x0) &&
     (pvVar1 = ares_htable_get(htable->hash,local_4), pvVar1 != (void *)0x0)) {
    return *(void **)((long)pvVar1 + 8);
  }
  return (void *)0x0;
}

Assistant:

void *ares_htable_asvp_get_direct(const ares_htable_asvp_t *htable,
                                  ares_socket_t             key)
{
  void *val = NULL;
  ares_htable_asvp_get(htable, key, &val);
  return val;
}